

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

uint8 * __thiscall
sentencepiece::NBestSentencePieceText::_InternalSerialize
          (NBestSentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  SentencePieceText *this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  int iVar9;
  size_t __n;
  
  iVar6 = (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (SentencePieceText *)
                ((this->nbests_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\n';
      uVar3 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar3 < 0x80) {
        target[1] = (byte)uVar3;
        puVar7 = target + 2;
      }
      else {
        target[1] = (byte)uVar3 | 0x80;
        if (uVar3 < 0x4000) {
          target[2] = (uint8)(uVar3 >> 7);
          puVar7 = target + 3;
        }
        else {
          puVar7 = target + 3;
          uVar3 = uVar3 >> 7;
          do {
            puVar8 = puVar7;
            puVar8[-1] = (byte)uVar3 | 0x80;
            uVar4 = uVar3 >> 7;
            puVar7 = puVar8 + 1;
            bVar2 = 0x3fff < uVar3;
            uVar3 = uVar4;
          } while (bVar2);
          *puVar8 = (uint8)uVar4;
        }
      }
      target = SentencePieceText::_InternalSerialize(this_00,puVar7,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar6);
  }
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    uVar5 = (ulong)pvVar1 & 0xfffffffffffffffe;
    pvVar1 = *(void **)(uVar5 + 8);
    iVar6 = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)iVar6;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,iVar6,target);
      return puVar7;
    }
    memcpy(target,pvVar1,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NBestSentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SentencePieceText nbests = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nbests_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_nbests(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NBestSentencePieceText)
  return target;
}